

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O3

bool P_Thing_CanRaise(AActor *thing)

{
  uint uVar1;
  BYTE *pBVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  int iVar7;
  FState *pFVar8;
  undefined4 extraout_var;
  DVector2 local_28;
  PClass *pPVar9;
  
  pFVar8 = AActor::GetRaiseState(thing);
  if (pFVar8 == (FState *)0x0) {
    bVar6 = false;
  }
  else {
    pPVar9 = (thing->super_DThinker).super_DObject.Class;
    if (pPVar9 == (PClass *)0x0) {
      iVar7 = (**(thing->super_DThinker).super_DObject._vptr_DObject)(thing);
      pPVar9 = (PClass *)CONCAT44(extraout_var,iVar7);
      (thing->super_DThinker).super_DObject.Class = pPVar9;
    }
    pBVar2 = pPVar9->Defaults;
    uVar1 = (thing->flags).Value;
    (thing->flags).Value = uVar1 | 2;
    local_28.X = (thing->__Pos).X;
    local_28.Y = (thing->__Pos).Y;
    dVar3 = thing->radius;
    dVar4 = thing->Height;
    dVar5 = *(double *)(pBVar2 + 0x180);
    thing->radius = *(double *)(pBVar2 + 0x178);
    thing->Height = dVar5;
    bVar6 = P_CheckPosition(thing,&local_28,false);
    (thing->flags).Value = uVar1;
    thing->radius = dVar3;
    thing->Height = dVar4;
  }
  return bVar6;
}

Assistant:

bool P_Thing_CanRaise(AActor *thing)
{
	FState * RaiseState = thing->GetRaiseState();
	if (RaiseState == NULL)
	{
		return false;
	}
	
	AActor *info = thing->GetDefault();

	// Check against real height and radius
	ActorFlags oldflags = thing->flags;
	double oldheight = thing->Height;
	double oldradius = thing->radius;

	thing->flags |= MF_SOLID;
	thing->Height = info->Height;
	thing->radius = info->radius;

	bool check = P_CheckPosition (thing, thing->Pos());

	// Restore checked properties
	thing->flags = oldflags;
	thing->radius = oldradius;
	thing->Height = oldheight;

	if (!check)
	{
		return false;
	}

	return true;
}